

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O3

array<unsigned_char,_4UL> PacketProcessor::ENumber(uint number,size_t *size)

{
  long lVar1;
  size_t sVar2;
  int i;
  uint uVar3;
  array<unsigned_char,_4UL> bytes;
  
  bytes._M_elems[0] = 0xfe;
  bytes._M_elems[1] = 0xfe;
  bytes._M_elems[2] = 0xfe;
  bytes._M_elems[3] = 0xfe;
  if (number < 0xf71ae5) {
    if (0xfa08 < number) goto LAB_0017fb9c;
    if (number < 0xfd) goto LAB_0017fbe6;
  }
  else {
    bytes._M_elems = (_Type)((uint)(byte)((char)(number / 0xf71ae5) + 1) << 0x18);
    number = number % 0xf71ae5;
LAB_0017fb9c:
    bytes._M_elems =
         (_Type)((uint)CONCAT11(bytes._M_elems[3],
                                (char)((ulong)number * 0x1061b6d9b >> 0x30) + '\x01') << 0x10);
    number = number % 0xfa09;
  }
  uVar3 = (number & 0xffff) / 0xfd;
  bytes._M_elems = (_Type)((uint)CONCAT21(bytes._M_elems._2_2_,(char)uVar3 + '\x01') << 8);
  number = number + uVar3 * -0xfd & 0xffff;
LAB_0017fbe6:
  bytes._M_elems[0] = (char)number + '\x01';
  uVar3 = 3;
  lVar1 = -4;
  do {
    if (bytes._M_elems[uVar3] != '\0') {
      sVar2 = -lVar1;
      goto LAB_0017fc14;
    }
    lVar1 = lVar1 + 1;
    uVar3 = uVar3 - 1;
  } while (uVar3 != 0);
  sVar2 = 1;
LAB_0017fc14:
  *size = sVar2;
  return (array<unsigned_char,_4UL>)bytes._M_elems;
}

Assistant:

std::array<unsigned char, 4> PacketProcessor::ENumber(unsigned int number, std::size_t &size)
{
	std::array<unsigned char, 4> bytes{{254, 254, 254, 254}};
	unsigned int onumber = number;

	if (onumber >= PacketProcessor::MAX3)
	{
		bytes[3] = number / PacketProcessor::MAX3 + 1;
		number = number % PacketProcessor::MAX3;
	}

	if (onumber >= PacketProcessor::MAX2)
	{
		bytes[2] = number / PacketProcessor::MAX2 + 1;
		number = number % PacketProcessor::MAX2;
	}

	if (onumber >= PacketProcessor::MAX1)
	{
		bytes[1] = number / PacketProcessor::MAX1 + 1;
		number = number % PacketProcessor::MAX1;
	}

	bytes[0] = number + 1;

	for (int i = 3; i >= 0; --i)
	{
		if (i == 0)
		{
			size = 1;
			break;
		}
		else if (bytes[i] > 0)
		{
			size = i + 1;
			break;
		}
	}

	return bytes;
}